

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_const_value.h
# Opt level: O2

int64_t __thiscall t_const_value::get_integer(t_const_value *this)

{
  int iVar1;
  long lVar2;
  t_enum_value *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 extraout_var;
  int64_t iVar5;
  string identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->valType_ == CV_IDENTIFIER) {
    if (this->enum_ == (t_enum *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_78,(string *)&this->identifierVal_);
      std::operator+(&identifier,"have identifier \"",&local_78);
      std::operator+(pbVar4,&identifier,"\", but unset enum on line!");
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::string((string *)&identifier,(string *)&this->identifierVal_);
    lVar2 = std::__cxx11::string::rfind((char)&identifier,0x2e);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)&identifier);
      std::__cxx11::string::operator=((string *)&identifier,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    ptVar3 = t_enum::get_constant_by_name(this->enum_,&identifier);
    if (ptVar3 == (t_enum_value *)0x0) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::operator+(&local_58,"Unable to find enum value \"",&identifier);
      std::operator+(&local_38,&local_58,"\" in enum \"");
      iVar1 = (*(this->enum_->super_t_type).super_t_doc._vptr_t_doc[3])();
      std::operator+(&local_78,&local_38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar1));
      std::operator+(pbVar4,&local_78,"\"");
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    iVar5 = (int64_t)ptVar3->value_;
    std::__cxx11::string::~string((string *)&identifier);
  }
  else {
    iVar5 = this->intVal_;
  }
  return iVar5;
}

Assistant:

int64_t get_integer() const {
    if (valType_ == CV_IDENTIFIER) {
      if (enum_ == nullptr) {
        throw "have identifier \"" + get_identifier() + "\", but unset enum on line!";
      }
      std::string identifier = get_identifier();
      std::string::size_type dot = identifier.rfind('.');
      if (dot != std::string::npos) {
        identifier = identifier.substr(dot + 1);
      }
      t_enum_value* val = enum_->get_constant_by_name(identifier);
      if (val == nullptr) {
        throw "Unable to find enum value \"" + identifier + "\" in enum \"" + enum_->get_name()
            + "\"";
      }
      return val->get_value();
    } else {
      return intVal_;
    }
  }